

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_sendfile(uv_fs_t *req)

{
  size_t len_00;
  int *piVar1;
  bool bVar2;
  int try_sendfile;
  size_t len;
  ssize_t r;
  off_t off;
  int out_fd;
  int in_fd;
  uv_fs_t *req_local;
  
  off._4_4_ = req->flags;
  off._0_4_ = req->file;
  r = req->off;
  len_00 = req->bufsml[0].len;
  _out_fd = req;
  len = uv__fs_try_copy_file_range(off._4_4_,&r,(int)off,len_00);
  bVar2 = false;
  if (len == 0xffffffffffffffff) {
    piVar1 = __errno_location();
    bVar2 = *piVar1 == 0x26;
  }
  if (bVar2) {
    len = sendfile64((int)off,off._4_4_,&r,len_00);
  }
  if ((len == 0xffffffffffffffff) && (r <= _out_fd->off)) {
    piVar1 = __errno_location();
    if ((((*piVar1 != 0x16) && (piVar1 = __errno_location(), *piVar1 != 5)) &&
        (piVar1 = __errno_location(), *piVar1 != 0x58)) &&
       (piVar1 = __errno_location(), *piVar1 != 0x12)) {
      return -1;
    }
    piVar1 = __errno_location();
    *piVar1 = 0;
    req_local = (uv_fs_t *)uv__fs_sendfile_emul(_out_fd);
  }
  else {
    req_local = (uv_fs_t *)(r - _out_fd->off);
    _out_fd->off = r;
  }
  return (ssize_t)req_local;
}

Assistant:

static ssize_t uv__fs_sendfile(uv_fs_t* req) {
  int in_fd;
  int out_fd;

  in_fd = req->flags;
  out_fd = req->file;

#if defined(__linux__) || defined(__sun)
  {
    off_t off;
    ssize_t r;
    size_t len;
    int try_sendfile;

    off = req->off;
    len = req->bufsml[0].len;
    try_sendfile = 1;

#ifdef __linux__
    r = uv__fs_try_copy_file_range(in_fd, &off, out_fd, len);
    try_sendfile = (r == -1 && errno == ENOSYS);
#endif

    if (try_sendfile)
      r = sendfile(out_fd, in_fd, &off, len);

    /* sendfile() on SunOS returns EINVAL if the target fd is not a socket but
     * it still writes out data. Fortunately, we can detect it by checking if
     * the offset has been updated.
     */
    if (r != -1 || off > req->off) {
      r = off - req->off;
      req->off = off;
      return r;
    }

    if (errno == EINVAL ||
        errno == EIO ||
        errno == ENOTSOCK ||
        errno == EXDEV) {
      errno = 0;
      return uv__fs_sendfile_emul(req);
    }

    return -1;
  }
#elif defined(__APPLE__) || defined(__DragonFly__) || defined(__FreeBSD__)
  {
    off_t len;
    ssize_t r;

    /* sendfile() on FreeBSD and Darwin returns EAGAIN if the target fd is in
     * non-blocking mode and not all data could be written. If a non-zero
     * number of bytes have been sent, we don't consider it an error.
     */

#if defined(__FreeBSD__) || defined(__DragonFly__)
#if defined(__FreeBSD__)
    off_t off;

    off = req->off;
    r = uv__fs_copy_file_range(in_fd, &off, out_fd, NULL, req->bufsml[0].len, 0);
    if (r >= 0) {
        r = off - req->off;
        req->off = off;
        return r;
    }
#endif
    len = 0;
    r = sendfile(in_fd, out_fd, req->off, req->bufsml[0].len, NULL, &len, 0);
#else
    /* The darwin sendfile takes len as an input for the length to send,
     * so make sure to initialize it with the caller's value. */
    len = req->bufsml[0].len;
    r = sendfile(in_fd, out_fd, req->off, &len, NULL, 0);
#endif

     /*
     * The man page for sendfile(2) on DragonFly states that `len` contains
     * a meaningful value ONLY in case of EAGAIN and EINTR.
     * Nothing is said about it's value in case of other errors, so better
     * not depend on the potential wrong assumption that is was not modified
     * by the syscall.
     */
    if (r == 0 || ((errno == EAGAIN || errno == EINTR) && len != 0)) {
      req->off += len;
      return (ssize_t) len;
    }

    if (errno == EINVAL ||
        errno == EIO ||
        errno == ENOTSOCK ||
        errno == EXDEV) {
      errno = 0;
      return uv__fs_sendfile_emul(req);
    }

    return -1;
  }
#else
  /* Squelch compiler warnings. */
  (void) &in_fd;
  (void) &out_fd;

  return uv__fs_sendfile_emul(req);
#endif
}